

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

uintptr_t http_sse_subscribe(http_sse_s *sse_,http_sse_subscribe_args args)

{
  char cVar1;
  _func_void_http_sse_s_ptr *p_Var2;
  subscribe_args_s args_00;
  size_t *psVar3;
  subscription_s *psVar4;
  _func_void_http_sse_s_ptr *p_Var5;
  int *piVar6;
  long lVar7;
  undefined8 unaff_RBX;
  undefined8 *puVar8;
  undefined8 *puVar9;
  char *format;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  byte bVar10;
  undefined8 unaff_retaddr;
  fio_lock_i ret;
  undefined8 auStackY_c8 [10];
  timespec local_78;
  undefined4 local_60 [2];
  size_t local_58;
  size_t sStackY_50;
  char *local_48;
  fio_match_fn local_40;
  code *local_38;
  code *local_30;
  http_sse_s *local_28;
  
  bVar10 = 0;
  if (sse_[1].on_open == (_func_void_http_sse_s_ptr *)0xffffffffffffffff) {
    return 0;
  }
  if (args.on_message == (_func_void_http_sse_s_ptr_fio_str_info_s_fio_str_info_s_void_ptr *)0x0) {
    args.on_message = http_sse_on_message__direct;
  }
  psVar3 = (size_t *)fio_malloc(0x38);
  if (psVar3 == (size_t *)0x0) {
    if (FIO_LOG_LEVEL < 1) goto LAB_0014a6ae;
    format = 
    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/http.c:1283"
    ;
  }
  else {
    psVar3[6] = (size_t)args.match;
    psVar3[4] = (size_t)args.on_unsubscribe;
    psVar3[5] = (size_t)args.udata;
    psVar3[2] = (size_t)args.channel.data;
    psVar3[3] = (size_t)args.on_message;
    *psVar3 = args.channel.capa;
    psVar3[1] = args.channel.len;
    LOCK();
    sse_[2].on_shutdown = sse_[2].on_shutdown + 1;
    UNLOCK();
    local_60[0] = 0;
    local_58 = args.channel.capa;
    sStackY_50 = args.channel.len;
    local_48 = args.channel.data;
    local_40 = args.match;
    local_38 = http_sse_on_message;
    local_30 = http_sse_on_unsubscribe;
    local_28 = sse_;
    puVar8 = (undefined8 *)local_60;
    puVar9 = auStackY_c8;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar9 = *puVar8;
      puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
      puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
    }
    args_00.channel.capa = unaff_RBX;
    args_00._0_8_ = psVar3;
    args_00.channel.len = unaff_R14;
    args_00.channel.data = (char *)unaff_R15;
    args_00.on_message = (_func_void_fio_msg_s_ptr *)args.channel.capa;
    args_00.match = (fio_match_fn)unaff_retaddr;
    args_00.on_unsubscribe = (_func_void_void_ptr_void_ptr *)args.channel.len;
    args_00.udata1 = args.channel.data;
    args_00.udata2 = args.on_message;
    psVar4 = fio_subscribe(args_00);
    if (psVar4 == (subscription_s *)0x0) {
      return 0;
    }
    LOCK();
    cVar1 = *(char *)&sse_[2].on_ready;
    *(undefined1 *)&sse_[2].on_ready = 1;
    UNLOCK();
    local_78.tv_sec = CONCAT71(local_78.tv_sec._1_7_,cVar1);
    if (cVar1 != '\0') {
      do {
        local_78.tv_sec = 0;
        local_78.tv_nsec = 1;
        nanosleep(&local_78,(timespec *)0x0);
        LOCK();
        cVar1 = *(char *)&sse_[2].on_ready;
        *(undefined1 *)&sse_[2].on_ready = 1;
        UNLOCK();
        local_78.tv_sec = CONCAT71(local_78.tv_sec._1_7_,cVar1);
      } while (cVar1 != '\0');
    }
    p_Var5 = (_func_void_http_sse_s_ptr *)calloc(0x18,1);
    if (p_Var5 != (_func_void_http_sse_s_ptr *)0x0) {
      p_Var2 = sse_[1].on_close;
      *(_func_void_http_sse_s_ptr **)p_Var5 = p_Var2;
      *(_func_void_http_sse_s_ptr ***)(p_Var5 + 8) = &sse_[1].on_close;
      *(subscription_s **)(p_Var5 + 0x10) = psVar4;
      *(_func_void_http_sse_s_ptr **)(p_Var2 + 8) = p_Var5;
      sse_[1].on_close = p_Var5;
      LOCK();
      *(undefined1 *)&sse_[2].on_ready = 0;
      UNLOCK();
      return (uintptr_t)p_Var5;
    }
    if (FIO_LOG_LEVEL < 1) goto LAB_0014a6ae;
    format = 
    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:3313"
    ;
  }
  FIO_LOG2STDERR(format);
LAB_0014a6ae:
  kill(0,2);
  piVar6 = __errno_location();
  exit(*piVar6);
}

Assistant:

uintptr_t http_sse_subscribe(http_sse_s *sse_,
                             struct http_sse_subscribe_args args) {
  http_sse_internal_s *sse = FIO_LS_EMBD_OBJ(http_sse_internal_s, sse, sse_);
  if (sse->uuid == -1)
    return 0;
  if (!args.on_message)
    args.on_message = http_sse_on_message__direct;
  struct http_sse_subscribe_args *udata = fio_malloc(sizeof(*udata));
  FIO_ASSERT_ALLOC(udata);
  *udata = args;

  fio_atomic_add(&sse->ref, 1);
  subscription_s *sub =
      fio_subscribe(.channel = args.channel, .on_message = http_sse_on_message,
                    .on_unsubscribe = http_sse_on_unsubscribe, .udata1 = sse,
                    .udata2 = udata, .match = args.match);
  if (!sub)
    return 0;

  fio_lock(&sse->lock);
  fio_ls_s *pos = fio_ls_push(&sse->subscriptions, sub);
  fio_unlock(&sse->lock);
  return (uintptr_t)pos;
}